

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

SpecialProperties Catch::anon_unknown_2::parseSpecialTag(string *tag)

{
  bool bVar1;
  SpecialProperties SVar2;
  
  SVar2 = IsHidden;
  if (((tag->_M_string_length == 0) || (*(tag->_M_dataplus)._M_p != '.')) &&
     (bVar1 = std::operator==(tag,"!hide"), !bVar1)) {
    bVar1 = std::operator==(tag,"!throws");
    if (bVar1) {
      SVar2 = Throws;
    }
    else {
      bVar1 = std::operator==(tag,"!shouldfail");
      if (bVar1) {
        SVar2 = ShouldFail;
      }
      else {
        bVar1 = std::operator==(tag,"!mayfail");
        if (bVar1) {
          SVar2 = MayFail;
        }
        else {
          bVar1 = std::operator==(tag,"!nonportable");
          if (bVar1) {
            SVar2 = NonPortable;
          }
          else {
            bVar1 = std::operator==(tag,"!benchmark");
            SVar2 = Benchmark|IsHidden;
            if (!bVar1) {
              SVar2 = None;
            }
          }
        }
      }
    }
  }
  return SVar2;
}

Assistant:

TestCaseInfo::SpecialProperties parseSpecialTag( std::string const& tag ) {
            if( startsWith( tag, '.' ) ||
                tag == "!hide" )
                return TestCaseInfo::IsHidden;
            else if( tag == "!throws" )
                return TestCaseInfo::Throws;
            else if( tag == "!shouldfail" )
                return TestCaseInfo::ShouldFail;
            else if( tag == "!mayfail" )
                return TestCaseInfo::MayFail;
            else if( tag == "!nonportable" )
                return TestCaseInfo::NonPortable;
            else if( tag == "!benchmark" )
                return static_cast<TestCaseInfo::SpecialProperties>( TestCaseInfo::Benchmark | TestCaseInfo::IsHidden );
            else
                return TestCaseInfo::None;
        }